

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

uint __thiscall
TArray<sector_t,_sector_t>::Push(TArray<sector_t,_sector_t> *this,sector_t_conflict *item)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  sector_t_conflict *psVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  double dVar8;
  AActor *pAVar9;
  double dVar10;
  sector_t_conflict *psVar11;
  short sVar12;
  short sVar13;
  undefined2 uVar14;
  undefined4 uVar15;
  WORD WVar16;
  WORD WVar17;
  DWORD DVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  BYTE *pBVar22;
  BYTE *pBVar23;
  byte bVar24;
  
  bVar24 = 0;
  Grow(this,1);
  uVar3 = this->Count;
  psVar4 = this->Array;
  lVar21 = 0x38;
  do {
    *(undefined8 *)((long)psVar4[uVar3].planes + lVar21 + -0x18) =
         *(undefined8 *)((long)item->planes + lVar21 + -0x18);
    puVar1 = (undefined8 *)((long)item->planes + lVar21 + -0x38);
    uVar5 = *puVar1;
    uVar6 = puVar1[1];
    puVar1 = (undefined8 *)((long)item->planes + lVar21 + -0x28);
    uVar7 = puVar1[1];
    puVar2 = (undefined8 *)((long)psVar4[uVar3].planes + lVar21 + -0x28);
    *puVar2 = *puVar1;
    puVar2[1] = uVar7;
    puVar1 = (undefined8 *)((long)psVar4[uVar3].planes + lVar21 + -0x38);
    *puVar1 = uVar5;
    puVar1[1] = uVar6;
    *(undefined8 *)((long)psVar4[uVar3].planes + lVar21 + -0x10) =
         *(undefined8 *)((long)item->planes + lVar21 + -0x10);
    *(undefined8 *)((long)psVar4[uVar3].planes + lVar21 + -8) =
         *(undefined8 *)((long)item->planes + lVar21 + -8);
    puVar1 = (undefined8 *)((long)&item->planes[0].xform.xOffs + lVar21);
    uVar5 = puVar1[1];
    puVar2 = (undefined8 *)((long)&item->planes[0].xform.baseyOffs + lVar21);
    uVar6 = *puVar2;
    uVar7 = puVar2[1];
    puVar2 = (undefined8 *)((long)&psVar4[uVar3].planes[0].xform.xOffs + lVar21);
    *puVar2 = *puVar1;
    puVar2[1] = uVar5;
    puVar1 = (undefined8 *)((long)&psVar4[uVar3].planes[0].xform.baseyOffs + lVar21);
    *puVar1 = uVar6;
    puVar1[1] = uVar7;
    lVar21 = lVar21 + 0x58;
  } while (lVar21 != 0xe8);
  dVar8 = (item->floorplane).normal.Y;
  psVar4[uVar3].floorplane.normal.X = (item->floorplane).normal.X;
  psVar4[uVar3].floorplane.normal.Y = dVar8;
  psVar4[uVar3].floorplane.normal.Z = (item->floorplane).normal.Z;
  dVar8 = (item->floorplane).negiC;
  psVar4[uVar3].floorplane.D = (item->floorplane).D;
  psVar4[uVar3].floorplane.negiC = dVar8;
  dVar8 = (item->ceilingplane).normal.Y;
  psVar4[uVar3].ceilingplane.normal.X = (item->ceilingplane).normal.X;
  psVar4[uVar3].ceilingplane.normal.Y = dVar8;
  psVar4[uVar3].ceilingplane.normal.Z = (item->ceilingplane).normal.Z;
  dVar8 = (item->ceilingplane).negiC;
  psVar4[uVar3].ceilingplane.D = (item->ceilingplane).D;
  psVar4[uVar3].ceilingplane.negiC = dVar8;
  psVar4[uVar3].ColorMap = item->ColorMap;
  psVar4[uVar3].SoundTarget.field_0 = (item->SoundTarget).field_0;
  sVar12 = item->lightlevel;
  sVar13 = item->seqType;
  uVar14 = *(undefined2 *)&item->field_0x116;
  psVar11 = psVar4 + uVar3;
  psVar11->special = item->special;
  psVar11->lightlevel = sVar12;
  psVar11->seqType = sVar13;
  *(undefined2 *)&psVar11->field_0x116 = uVar14;
  psVar4[uVar3].sky = item->sky;
  psVar4[uVar3].SeqName.super_FName.Index = (item->SeqName).super_FName.Index;
  dVar8 = (item->centerspot).Y;
  psVar4[uVar3].centerspot.X = (item->centerspot).X;
  psVar4[uVar3].centerspot.Y = dVar8;
  uVar15 = *(undefined4 *)&item->field_0x134;
  pAVar9 = item->thinglist;
  dVar8 = item->friction;
  dVar10 = item->movefactor;
  psVar4[uVar3].validcount = item->validcount;
  *(undefined4 *)&psVar4[uVar3].field_0x134 = uVar15;
  psVar4[uVar3].thinglist = pAVar9;
  psVar4[uVar3].friction = dVar8;
  psVar4[uVar3].movefactor = dVar10;
  *(undefined8 *)psVar4[uVar3].terrainnum = *(undefined8 *)item->terrainnum;
  psVar4[uVar3].floordata.field_0 = (item->floordata).field_0;
  psVar4[uVar3].ceilingdata.field_0 = (item->ceilingdata).field_0;
  psVar4[uVar3].lightingdata.field_0 = (item->lightingdata).field_0;
  lVar21 = 0;
  do {
    psVar4[uVar3].interpolations[lVar21].field_0 = item->interpolations[lVar21].field_0;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 4);
  pBVar22 = &item->soundtraversed;
  pBVar23 = &psVar4[uVar3].soundtraversed;
  for (lVar21 = 10; lVar21 != 0; lVar21 = lVar21 + -1) {
    *(undefined8 *)pBVar23 = *(undefined8 *)pBVar22;
    pBVar22 = pBVar22 + ((ulong)bVar24 * -2 + 1) * 8;
    pBVar23 = pBVar23 + ((ulong)bVar24 * -2 + 1) * 8;
  }
  psVar4[uVar3].damagetype.super_FName.Index = (item->damagetype).super_FName.Index;
  sVar12 = item->damageinterval;
  sVar13 = item->leakydamage;
  WVar16 = item->ZoneNumber;
  WVar17 = item->MoreFlags;
  DVar18 = item->Flags;
  psVar11 = psVar4 + uVar3;
  psVar11->damageamount = item->damageamount;
  psVar11->damageinterval = sVar12;
  psVar11->leakydamage = sVar13;
  psVar11 = psVar4 + uVar3;
  psVar11->ZoneNumber = WVar16;
  psVar11->MoreFlags = WVar17;
  psVar11->Flags = DVar18;
  psVar4[uVar3].SecActTarget.field_0 = (item->SecActTarget).field_0;
  psVar4[uVar3].e = item->e;
  iVar19 = item->PortalGroup;
  iVar20 = item->sectornum;
  *(undefined8 *)psVar4[uVar3].Portals = *(undefined8 *)item->Portals;
  psVar4[uVar3].PortalGroup = iVar19;
  psVar4[uVar3].sectornum = iVar20;
  uVar3 = this->Count;
  this->Count = uVar3 + 1;
  return uVar3;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}